

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

CTransactionRef __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::FindTxForGetData
          (PeerManagerImpl *this,TxRelay *tx_relay,GenTxid *gtxid)

{
  long lVar1;
  bool bVar2;
  pointer __x;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *in_RSI;
  element_type *in_RDI;
  long in_FS_OFFSET;
  CTransactionRef CVar3;
  const_iterator it;
  TxMempoolInfo txinfo;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock58;
  TxMempoolInfo *in_stack_ffffffffffffff38;
  map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
  *in_stack_ffffffffffffff40;
  unique_ptr<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
  *in_stack_ffffffffffffff48;
  element_type *pszFile;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff70;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffff78;
  uint64_t in_stack_ffffffffffffffa8;
  GenTxid *in_stack_ffffffffffffffb0;
  CTxMemPool *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszFile = in_RDI;
  CTxMemPool::info_for_relay
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar2 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                     in_stack_ffffffffffffff38);
  if (bVar2) {
    std::shared_ptr<const_CTransaction>::shared_ptr
              (&in_stack_ffffffffffffff38->tx,(shared_ptr<const_CTransaction> *)0x109493d);
    goto LAB_01094aa7;
  }
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff38);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_RSI,(char *)pszFile,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  bVar2 = std::operator==(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_01094a76:
    bVar2 = false;
  }
  else {
    __x = std::
          unique_ptr<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
          ::operator->((unique_ptr<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                        *)in_stack_ffffffffffffff38);
    GenTxid::GetHash((GenTxid *)in_stack_ffffffffffffff38);
    std::
    map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
    ::find(in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
    std::
    unique_ptr<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
    ::operator->((unique_ptr<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                  *)in_stack_ffffffffffffff38);
    std::
    map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
    ::end(in_stack_ffffffffffffff40);
    bVar2 = std::operator==((_Self *)__x,(_Self *)in_stack_ffffffffffffff40);
    if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_01094a76;
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>::
    operator->((_Rb_tree_const_iterator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffff38);
    std::shared_ptr<const_CTransaction>::shared_ptr
              (&in_stack_ffffffffffffff38->tx,(shared_ptr<const_CTransaction> *)0x1094a32);
    bVar2 = true;
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff38);
  if (!bVar2) {
    std::shared_ptr<const_CTransaction>::shared_ptr(&in_stack_ffffffffffffff38->tx);
  }
LAB_01094aa7:
  TxMempoolInfo::~TxMempoolInfo(in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  CVar3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pszFile;
  return (CTransactionRef)CVar3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CTransactionRef PeerManagerImpl::FindTxForGetData(const Peer::TxRelay& tx_relay, const GenTxid& gtxid)
{
    // If a tx was in the mempool prior to the last INV for this peer, permit the request.
    auto txinfo = m_mempool.info_for_relay(gtxid, tx_relay.m_last_inv_sequence);
    if (txinfo.tx) {
        return std::move(txinfo.tx);
    }

    // Or it might be from the most recent block
    {
        LOCK(m_most_recent_block_mutex);
        if (m_most_recent_block_txs != nullptr) {
            auto it = m_most_recent_block_txs->find(gtxid.GetHash());
            if (it != m_most_recent_block_txs->end()) return it->second;
        }
    }

    return {};
}